

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

char * cmd_name(skynet_context *context,char *param)

{
  char *context_00;
  uint32_t handle;
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  char acStack_60 [8];
  char *local_58;
  char *local_50;
  uint32_t local_48;
  uint32_t handle_id;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_24;
  char *pcStack_20;
  int size;
  char *param_local;
  skynet_context *context_local;
  
  acStack_60[0] = -0x77;
  acStack_60[1] = -0x73;
  acStack_60[2] = '\x11';
  acStack_60[3] = '\0';
  acStack_60[4] = '\0';
  acStack_60[5] = '\0';
  acStack_60[6] = '\0';
  acStack_60[7] = '\0';
  pcStack_20 = param;
  param_local = (char *)context;
  sVar1 = strlen(param);
  pcVar4 = pcStack_20;
  local_24 = (int)sVar1;
  __vla_expr1 = (unsigned_long)(local_24 + 1);
  local_58 = (char *)((long)&local_58 - (__vla_expr1 + 0xf & 0xfffffffffffffff0));
  _handle_id = (ulong)(local_24 + 1);
  pcVar3 = local_58 + -(_handle_id + 0xf & 0xfffffffffffffff0);
  local_50 = pcVar3;
  __vla_expr0 = (unsigned_long)&local_58;
  pcVar3[-8] = -0x19;
  pcVar3[-7] = -0x73;
  pcVar3[-6] = '\x11';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  __isoc99_sscanf(pcVar4,"%s %s");
  if (*local_50 == ':') {
    pcVar4 = local_50 + 1;
    pcVar3[-8] = '\x1a';
    pcVar3[-7] = -0x72;
    pcVar3[-6] = '\x11';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    uVar2 = strtoul(pcVar4,(char **)0x0,0x10);
    context_00 = param_local;
    pcVar4 = local_58;
    handle = (uint32_t)uVar2;
    if (handle == 0) {
      context_local = (skynet_context *)0x0;
    }
    else {
      local_48 = handle;
      if (*local_58 == '.') {
        pcVar4 = local_58 + 1;
        pcVar3[-8] = 'P';
        pcVar3[-7] = -0x72;
        pcVar3[-6] = '\x11';
        pcVar3[-5] = '\0';
        pcVar3[-4] = '\0';
        pcVar3[-3] = '\0';
        pcVar3[-2] = '\0';
        pcVar3[-1] = '\0';
        context_local = (skynet_context *)skynet_handle_namehandle(handle,pcVar4);
      }
      else {
        pcVar3[-8] = 's';
        pcVar3[-7] = -0x72;
        pcVar3[-6] = '\x11';
        pcVar3[-5] = '\0';
        pcVar3[-4] = '\0';
        pcVar3[-3] = '\0';
        pcVar3[-2] = '\0';
        pcVar3[-1] = '\0';
        skynet_error((skynet_context *)context_00,"Can\'t set global name %s in C",pcVar4);
        context_local = (skynet_context *)0x0;
      }
    }
  }
  else {
    context_local = (skynet_context *)0x0;
  }
  return (char *)context_local;
}

Assistant:

static const char *
cmd_name(struct skynet_context * context, const char * param) {
	int size = strlen(param);
	char name[size+1];
	char handle[size+1];
	sscanf(param,"%s %s",name,handle);
	if (handle[0] != ':') {
		return NULL;
	}
	uint32_t handle_id = strtoul(handle+1, NULL, 16);
	if (handle_id == 0) {
		return NULL;
	}
	if (name[0] == '.') {
		return skynet_handle_namehandle(handle_id, name + 1);
	} else {
		skynet_error(context, "Can't set global name %s in C", name);
	}
	return NULL;
}